

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptStackWalker::WalkToTarget(JavascriptStackWalker *this,JavascriptFunction *funcTarget)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CallFlags e;
  JavascriptFunction *pJVar4;
  CallInfo CVar5;
  undefined4 *puVar6;
  JavascriptFunction *funcTarget_local;
  JavascriptStackWalker *this_local;
  
  do {
    BVar3 = Walk(this,true);
    if (BVar3 == 0) {
      return 0;
    }
    bVar2 = IsJavascriptFrame(this);
  } while ((!bVar2) || (pJVar4 = GetCurrentFunction(this,true), pJVar4 != funcTarget));
  CVar5 = GetCallInfo(this,true);
  e = Js::operator&(CVar5._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),
                    CallFlags_InternalFrame);
  bVar2 = operator!(e);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x372,"(!(this->GetCallInfo().Flags & CallFlags_InternalFrame))",
                                "!(this->GetCallInfo().Flags & CallFlags_InternalFrame)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return 1;
}

Assistant:

BOOL JavascriptStackWalker::WalkToTarget(JavascriptFunction * funcTarget)
    {
        // Walk up the call stack until we find the frame that belongs to the given function.

        while (this->Walk(/*includeInlineFrames*/ true))
        {
            if (this->IsJavascriptFrame() && this->GetCurrentFunction() == funcTarget)
            {
                // Skip internal names
                Assert( !(this->GetCallInfo().Flags & CallFlags_InternalFrame) );
                return true;
            }
        }

        return false;
    }